

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_resample_filters.cpp
# Opt level: O0

float basisu::kaiser_filter(float t)

{
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  double unaff_retaddr;
  float alpha;
  float att;
  undefined4 in_stack_00000014;
  double in_stack_ffffffffffffffe8;
  undefined4 local_8;
  undefined4 local_4;
  
  local_8 = in_XMM0_Da;
  if (in_XMM0_Da < 0.0) {
    local_8 = -in_XMM0_Da;
  }
  if (3.0 <= local_8) {
    local_4 = 0.0;
  }
  else {
    dVar1 = log(11.122596799999998);
    exp(dVar1 * 0.4);
    dVar1 = sinc(in_stack_ffffffffffffffe8);
    dVar2 = kaiser((double)CONCAT44(in_stack_00000014,t),_alpha,unaff_retaddr);
    local_4 = clean(dVar1 * dVar2);
  }
  return local_4;
}

Assistant:

static float kaiser_filter(float t)
	{
		if (t < 0.0f)
			t = -t;

		if (t < KAISER_SUPPORT)
		{
			// db atten
			const float att = 40.0f;
			const float alpha = (float)(exp(log((double)0.58417 * (att - 20.96)) * 0.4) + 0.07886 * (att - 20.96));
			//const float alpha = KAISER_ALPHA;
			return (float)clean(sinc(t) * kaiser(alpha, KAISER_SUPPORT, t));
		}

		return 0.0f;
	}